

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AddEnvVar(ostream *out,char *envVar,cmLocalGenerator *lg)

{
  cmMakefile *this;
  bool bVar1;
  cmState *this_00;
  cmValue cVar2;
  long lVar3;
  cmake *this_01;
  string *path;
  ostream *poVar4;
  string valueToUse;
  char *envVar_local;
  string envVarValue;
  string cacheEntryName;
  
  this = lg->Makefile;
  envVarValue._M_dataplus._M_p = (pointer)&envVarValue.field_2;
  envVarValue._M_string_length = 0;
  envVarValue.field_2._M_local_buf[0] = '\0';
  envVar_local = envVar;
  bVar1 = cmsys::SystemTools::GetEnv(envVar,&envVarValue);
  cmStrCat<char_const(&)[22],char_const*&>
            (&cacheEntryName,(char (*) [22])"CMAKE_ECLIPSE_ENVVAR_",&envVar_local);
  this_00 = cmLocalGenerator::GetState(lg);
  cVar2 = cmState::GetInitializedCacheValue(this_00,&cacheEntryName);
  valueToUse._M_dataplus._M_p = (pointer)&valueToUse.field_2;
  valueToUse._M_string_length = 0;
  valueToUse.field_2._M_local_buf[0] = '\0';
  if (bVar1) {
    if (cVar2.Value == (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&valueToUse);
      cmMakefile::AddCacheDefinition
                (this,&cacheEntryName,&valueToUse,(cmValue)&cacheEntryName,STRING,true);
      this_01 = cmMakefile::GetCMakeInstance(this);
      path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&valueToUse);
      lVar3 = std::__cxx11::string::find((string *)&valueToUse,(ulong)&envVarValue);
      if (lVar3 != -1) goto LAB_003eaff5;
      std::__cxx11::string::_M_assign((string *)&valueToUse);
      cmMakefile::AddCacheDefinition
                (this,&cacheEntryName,&valueToUse,(cmValue)&cacheEntryName,STRING,true);
      this_01 = cmMakefile::GetCMakeInstance(this);
      path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
    }
    cmake::SaveCache(this_01,path);
  }
  else {
    if (cVar2.Value == (string *)0x0) goto LAB_003eb033;
    std::__cxx11::string::_M_assign((string *)&valueToUse);
  }
LAB_003eaff5:
  if (valueToUse._M_string_length != 0) {
    poVar4 = std::operator<<(out,envVar_local);
    poVar4 = std::operator<<(poVar4,"=");
    poVar4 = std::operator<<(poVar4,(string *)&valueToUse);
    std::operator<<(poVar4,"|");
  }
LAB_003eb033:
  std::__cxx11::string::~string((string *)&valueToUse);
  std::__cxx11::string::~string((string *)&cacheEntryName);
  std::__cxx11::string::~string((string *)&envVarValue);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(std::ostream& out,
                                            const char* envVar,
                                            cmLocalGenerator& lg)
{
  cmMakefile* mf = lg.GetMakefile();

  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  std::string envVarValue;
  const bool envVarSet = cmSystemTools::GetEnv(envVar, envVarValue);

  std::string cacheEntryName = cmStrCat("CMAKE_ECLIPSE_ENVVAR_", envVar);
  cmValue cacheValue = lg.GetState()->GetInitializedCacheValue(cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (!envVarSet && !cacheValue) {
    // nothing known, do nothing
    valueToUse.clear();
  } else if (envVarSet && !cacheValue) {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse, cacheEntryName,
                           cmStateEnums::STRING, true);
    mf->GetCMakeInstance()->SaveCache(lg.GetBinaryDirectory());
  } else if (!envVarSet && cacheValue) {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = *cacheValue;
  } else {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = *cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos) {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse, cacheEntryName,
                             cmStateEnums::STRING, true);
      mf->GetCMakeInstance()->SaveCache(lg.GetBinaryDirectory());
    }
  }

  if (!valueToUse.empty()) {
    out << envVar << "=" << valueToUse << "|";
  }
}